

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringLowering.cpp
# Opt level: O0

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::StringLowering::replaceInstructions::Replacer::create(Replacer *this)

{
  undefined1 local_20 [16];
  Replacer *this_local;
  
  this_local = (Replacer *)this;
  std::
  make_unique<wasm::StringLowering::replaceInstructions(wasm::Module*)::Replacer,wasm::StringLowering&>
            ((StringLowering *)local_20);
  std::unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>>::
  unique_ptr<wasm::StringLowering::replaceInstructions(wasm::Module*)::Replacer,std::default_delete<wasm::StringLowering::replaceInstructions(wasm::Module*)::Replacer>,void>
            ((unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>> *)this,
             (unique_ptr<Replacer,_std::default_delete<Replacer>_> *)local_20);
  std::unique_ptr<Replacer,_std::default_delete<Replacer>_>::~unique_ptr
            ((unique_ptr<Replacer,_std::default_delete<Replacer>_> *)local_20);
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
        return std::make_unique<Replacer>(lowering);
      }